

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_update_fprs_dirty(DisasContext_conflict8 *dc,int rd)

{
  TCGContext_conflict8 *tcg_ctx_00;
  uint arg2;
  TCGContext_conflict8 *tcg_ctx;
  int bit;
  int rd_local;
  DisasContext_conflict8 *dc_local;
  
  arg2 = 2;
  if (rd < 0x20) {
    arg2 = 1;
  }
  tcg_ctx_00 = dc->uc->tcg_ctx;
  if ((dc->fprs_dirty & arg2) == 0) {
    dc->fprs_dirty = arg2 | dc->fprs_dirty;
    tcg_gen_ori_i32_sparc64(tcg_ctx_00,tcg_ctx_00->cpu_fprs,tcg_ctx_00->cpu_fprs,arg2);
  }
  return;
}

Assistant:

static inline void gen_update_fprs_dirty(DisasContext *dc, int rd)
{
#if defined(TARGET_SPARC64)
    int bit = (rd < 32) ? 1 : 2;
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    /* If we know we've already set this bit within the TB,
       we can avoid setting it again.  */
    if (!(dc->fprs_dirty & bit)) {
        dc->fprs_dirty |= bit;
        tcg_gen_ori_i32(tcg_ctx, tcg_ctx->cpu_fprs, tcg_ctx->cpu_fprs, bit);
    }
#endif
}